

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_PlaneEquation * ON_PlaneEquation::CreateFromPointAndNormal(ON_3dPoint point,ON_3dVector normal)

{
  double *this;
  bool bVar1;
  ON_PlaneEquation *in_RDI;
  double dVar2;
  double dVar3;
  double in_stack_00000008;
  ON_PlaneEquation *e;
  undefined1 local_20 [8];
  ON_3dVector N;
  
  this = &point.z;
  bVar1 = ON_3dPoint::IsValid((ON_3dPoint *)&stack0x00000008);
  if ((!bVar1) || (bVar1 = ON_3dVector::IsValid((ON_3dVector *)this), !bVar1)) goto LAB_007e6baa;
  ON_3dVector::UnitVector((ON_3dVector *)local_20,(ON_3dVector *)this);
  bVar1 = ON_3dVector::IsUnitVector((ON_3dVector *)this);
  if (bVar1) {
    dVar2 = ON_3dVector::Length((ON_3dVector *)local_20);
    dVar3 = ON_3dVector::Length((ON_3dVector *)this);
    if (ABS(1.0 - dVar2) < ABS(1.0 - dVar3) * 0.9999999997671694) goto LAB_007e6b03;
  }
  else {
LAB_007e6b03:
    normal.x = N.x;
    normal.y = N.y;
  }
  bVar1 = ON_3dVector::IsUnitVector((ON_3dVector *)this);
  if (bVar1) {
    ON_PlaneEquation(in_RDI);
    in_RDI->x = point.z;
    in_RDI->y = normal.x;
    in_RDI->z = normal.y;
    in_RDI->d = -(in_RDI->z * point.y + in_RDI->x * in_stack_00000008 + in_RDI->y * point.x);
    return in_RDI;
  }
LAB_007e6baa:
  in_RDI->x = NanPlaneEquation.x;
  in_RDI->y = NanPlaneEquation.y;
  in_RDI->z = NanPlaneEquation.z;
  in_RDI->d = NanPlaneEquation.d;
  return in_RDI;
}

Assistant:

const ON_PlaneEquation ON_PlaneEquation::CreateFromPointAndNormal(
  ON_3dPoint point,
  ON_3dVector normal
)
{
  if (point.IsValid() && normal.IsValid())
  {
    const ON_3dVector N = normal.UnitVector();
    if (false == normal.IsUnitVector() || fabs(1.0 - N.Length()) < fabs(1.0 - normal.Length()) * (1.0 - ON_ZERO_TOLERANCE))
      normal = N; // N is a better unit vector
    if (normal.IsUnitVector())
    {
      ON_PlaneEquation e;
      e.x = normal.x;
      e.y = normal.y;
      e.z = normal.z;
      e.d = -(e.x * point.x + e.y * point.y + e.z * point.z);
      return e;
    }
  }
  return ON_PlaneEquation::NanPlaneEquation;
}